

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_encode_pipeline_t *encode)

{
  void *in_RCX;
  void *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_encode_pipeline_t nil;
  exr_result_t rv;
  exr_const_context_t in_stack_fffffffffffffdd0;
  exr_const_priv_part_t in_stack_fffffffffffffdf0;
  exr_const_context_t in_stack_fffffffffffffdf8;
  exr_chunk_info_t *in_stack_fffffffffffffe00;
  exr_coding_channel_info_t *in_stack_fffffffffffffe08;
  int16_t *in_stack_fffffffffffffe10;
  exr_coding_channel_info_t **in_stack_fffffffffffffe18;
  exr_result_t local_4;
  
  memset(&stack0xfffffffffffffdd0,0,0x200);
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_fffffffffffffdd0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_fffffffffffffdd0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if ((in_RDX == (void *)0x0) || (in_RCX == (void *)0x0)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_fffffffffffffdd0);
      }
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
    }
    else if ((*in_RDI == '\x03') || (*in_RDI == '\x04')) {
      memcpy(in_RCX,&stack0xfffffffffffffdd0,0x200);
      local_4 = internal_coding_fill_channel_info
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      if (local_4 == 0) {
        *(int *)((long)in_RCX + 0x14) = in_ESI;
        *(char **)((long)in_RCX + 0x18) = in_RDI;
        memcpy((void *)((long)in_RCX + 0x20),in_RDX,0x40);
      }
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_fffffffffffffdd0);
      }
    }
    else if (*in_RDI == '\x01') {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_fffffffffffffdd0);
      }
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,9);
    }
    else {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_fffffffffffffdd0);
      }
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_encoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t          rv;
    exr_encode_pipeline_t nil = {0};

    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA &&
        ctxt->mode != EXR_CONTEXT_TEMPORARY)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_WRITE_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    *encode = nil;

    rv = internal_coding_fill_channel_info (
        &(encode->channels),
        &(encode->channel_count),
        encode->_quick_chan_store,
        cinfo,
        ctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        encode->part_index = part_index;
        encode->context    = ctxt;
        encode->chunk      = *cinfo;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}